

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O2

string * __thiscall
FIX::HttpMessage::toString_abi_cxx11_(string *__return_storage_ptr__,HttpMessage *this)

{
  string str;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  toString(this,&local_28);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string HttpMessage::toString() const
{
  std::string str;
  return toString( str );
}